

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O0

int canvas_isconnected(_glist *x,t_text *ob1,int n1,t_text *ob2,int n2)

{
  _outconnect *p_Var1;
  _outconnect *oc;
  t_linetraverser t;
  int n2_local;
  t_text *ob2_local;
  int n1_local;
  t_text *ob1_local;
  _glist *x_local;
  
  t._116_4_ = n2;
  linetraverser_start((t_linetraverser *)&oc,x);
  do {
    p_Var1 = linetraverser_next((t_linetraverser *)&oc);
    if (p_Var1 == (_outconnect *)0x0) {
      return 0;
    }
  } while ((((t.tr_x != (_glist *)ob1) || (t.tr_ob._4_4_ != n1)) || ((t_text *)t._16_8_ != ob2)) ||
          (t.tr_inlet._4_4_ != t._116_4_));
  return 1;
}

Assistant:

int canvas_isconnected (t_canvas *x, t_text *ob1, int n1,
    t_text *ob2, int n2)
{
    t_linetraverser t;
    t_outconnect *oc;
    linetraverser_start(&t, x);
    while ((oc = linetraverser_next(&t)))
        if (t.tr_ob == ob1 && t.tr_outno == n1 &&
            t.tr_ob2 == ob2 && t.tr_inno == n2)
                return (1);
    return (0);
}